

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

WriteStream * __thiscall
soul::PoolAllocator::
allocate<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
          (PoolAllocator *this,CodeLocation *args,OutputDeclaration *args_1,
          pool_ptr<soul::heart::Expression> *args_2,Expression *args_3)

{
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_65 [13];
  pool_ptr<soul::heart::Expression> local_58;
  CodeLocation local_50;
  WriteStream *local_40;
  WriteStream *newObject;
  PoolItem *newItem;
  Expression *args_local_3;
  pool_ptr<soul::heart::Expression> *args_local_2;
  OutputDeclaration *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (Expression *)args_2;
  args_local_2 = (pool_ptr<soul::heart::Expression> *)args_1;
  args_local_1 = (OutputDeclaration *)args;
  args_local = (CodeLocation *)this;
  newObject = (WriteStream *)allocateSpaceForObject(this,0x38);
  this_00 = &(newObject->super_Statement).super_Object.location.location;
  CodeLocation::CodeLocation(&local_50,(CodeLocation *)args_local_1);
  local_58.object = (Expression *)(args_local_3->super_Object)._vptr_Object;
  heart::WriteStream::WriteStream
            ((WriteStream *)this_00,&local_50,(OutputDeclaration *)args_local_2,&local_58,
             (Expression *)newItem);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_58);
  CodeLocation::~CodeLocation(&local_50);
  local_40 = (WriteStream *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation&&,soul::heart::OutputDeclaration&,soul::pool_ptr&,soul::heart::Expression&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_65);
  (newObject->super_Statement).super_Object.location.sourceCode.object = pSVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }